

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int client_decode_ech_config_list
              (ptls_context_t *ctx,st_decoded_ech_config_t *decoded,ptls_iovec_t config_list)

{
  ptls_hpke_cipher_suite_t **pppVar1;
  bool bVar2;
  ushort uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ushort *puVar7;
  char *name;
  ulong uVar8;
  size_t sVar9;
  ushort *puVar10;
  ushort uVar11;
  ushort *puVar12;
  ptls_hpke_kem_t **pppVar13;
  ushort *puVar14;
  ushort *puVar15;
  ushort *puVar16;
  ptls_hpke_cipher_suite_t **pppVar17;
  ptls_hpke_cipher_suite_t *ppVar18;
  ushort *puVar19;
  ptls_hpke_cipher_suite_t *ppVar20;
  ptls_hpke_cipher_suite_t *ppVar21;
  ptls_hpke_cipher_suite_t *ppVar22;
  ushort *puVar23;
  
  uVar8 = config_list.len;
  puVar12 = (ushort *)config_list.base;
  (decoded->bytes).base = (uint8_t *)0x0;
  (decoded->bytes).len = 0;
  (decoded->public_name).base = (uint8_t *)0x0;
  (decoded->public_name).len = 0;
  decoded->cipher = (ptls_hpke_cipher_suite_t *)0x0;
  *(undefined8 *)&decoded->max_name_length = 0;
  (decoded->public_key).base = (uint8_t *)0x0;
  (decoded->public_key).len = 0;
  *(undefined8 *)decoded = 0;
  decoded->kem = (ptls_hpke_kem_t *)0x0;
  iVar4 = 0x32;
  if ((1 < uVar8) && (uVar6 = (ulong)(ushort)(*puVar12 << 8 | *puVar12 >> 8), uVar6 <= uVar8 - 2)) {
    puVar19 = (ushort *)((long)puVar12 + uVar6 + 2);
    bVar2 = false;
    puVar15 = puVar12 + 1;
    do {
      iVar4 = 0x32;
      if (((long)puVar19 - (long)puVar15 < 2) || (((long)puVar19 - (long)puVar15) - 2U < 2))
      goto LAB_001186e3;
      uVar11 = puVar15[1] << 8 | puVar15[1] >> 8;
      uVar6 = (ulong)uVar11;
      if ((ulong)((long)puVar19 - (long)(puVar15 + 2)) < uVar6) goto LAB_001186e3;
      puVar16 = (ushort *)((long)puVar15 + uVar6 + 4);
      if ((ushort)(*puVar15 << 8 | *puVar15 >> 8) == 0xfe0d) {
        iVar4 = 0x32;
        if ((uVar6 == 0) || (uVar11 < 3)) {
LAB_001186d6:
          name = (char *)0x0;
        }
        else {
          pppVar13 = (ctx->ech).client.kems;
          ppVar21 = (ptls_hpke_cipher_suite_t *)*pppVar13;
          if (ppVar21 != (ptls_hpke_cipher_suite_t *)0x0) {
            do {
              pppVar13 = pppVar13 + 1;
              if ((ppVar21->id).kdf ==
                  (uint16_t)
                  (*(ushort *)((long)puVar15 + 5) << 8 | *(ushort *)((long)puVar15 + 5) >> 8))
              goto LAB_00118379;
              ppVar21 = (ptls_hpke_cipher_suite_t *)*pppVar13;
            } while (ppVar21 != (ptls_hpke_cipher_suite_t *)0x0);
          }
          ppVar21 = (ptls_hpke_cipher_suite_t *)0x0;
LAB_00118379:
          if ((uVar6 - 3 < 2) ||
             (uVar5 = (ulong)(ushort)(*(ushort *)((long)puVar15 + 7) << 8 |
                                     *(ushort *)((long)puVar15 + 7) >> 8), uVar6 - 5 <= uVar5 - 1))
          goto LAB_001186d6;
          puVar7 = (ushort *)((uint8_t *)((long)puVar15 + 9) + uVar5);
          if ((ulong)((long)puVar16 - (long)puVar7) < 2) goto LAB_001186d6;
          puVar14 = puVar7 + 1;
          uVar6 = (ulong)(ushort)(*puVar7 << 8 | *puVar7 >> 8);
          if ((ulong)((long)puVar16 - (long)puVar14) < uVar6) goto LAB_001186d6;
          pppVar1 = (ctx->ech).client.ciphers;
          uVar11 = puVar15[2];
          puVar7 = (ushort *)(uVar6 + (long)puVar14);
          ppVar22 = (ptls_hpke_cipher_suite_t *)0x0;
          do {
            puVar23 = puVar14;
            if (((long)puVar7 - (long)puVar23 < 2) || (((long)puVar7 - (long)puVar23) + -2 < 2))
            goto LAB_001186bd;
            if (ppVar22 == (ptls_hpke_cipher_suite_t *)0x0) {
              ppVar22 = *pppVar1;
              if (ppVar22 != (ptls_hpke_cipher_suite_t *)0x0) {
                pppVar17 = pppVar1;
                do {
                  pppVar17 = pppVar17 + 1;
                  if (((ppVar22->id).kdf == (uint16_t)(*puVar23 << 8 | *puVar23 >> 8)) &&
                     ((ppVar22->id).aead == (uint16_t)(puVar23[1] << 8 | puVar23[1] >> 8)))
                  goto LAB_0011845f;
                  ppVar22 = *pppVar17;
                } while (ppVar22 != (ptls_hpke_cipher_suite_t *)0x0);
              }
              ppVar22 = (ptls_hpke_cipher_suite_t *)0x0;
            }
LAB_0011845f:
            puVar14 = puVar23 + 2;
          } while (puVar23 + 2 != puVar7);
          if ((puVar7 == puVar16) || ((ushort *)((long)puVar23 + 5) == puVar16)) {
LAB_001186bd:
            name = (char *)0x0;
LAB_001186bf:
            iVar4 = 0x32;
          }
          else {
            uVar6 = (ulong)*(byte *)((long)puVar23 + 5);
            puVar23 = puVar23 + 3;
            if (((ulong)((long)puVar16 - (long)puVar23) < uVar6) || (uVar6 == 0)) goto LAB_001186bd;
            uVar3 = *puVar7;
            name = (char *)malloc(uVar6 + 1);
            if (name == (char *)0x0) {
              iVar4 = 0x201;
              goto LAB_001186d6;
            }
            memcpy(name,puVar23,uVar6);
            name[uVar6] = '\0';
            iVar4 = ptls_server_name_is_ipaddr(name);
            sVar9 = 0;
            ppVar18 = (ptls_hpke_cipher_suite_t *)0x0;
            puVar7 = (ushort *)0x0;
            ppVar20 = (ptls_hpke_cipher_suite_t *)0x0;
            if (iVar4 == 0) {
              sVar9 = uVar6;
              ppVar18 = ppVar21;
              puVar7 = puVar23;
              ppVar20 = ppVar22;
            }
            puVar23 = (ushort *)((long)puVar23 + uVar6);
            if ((ulong)((long)puVar16 - (long)puVar23) < 2) goto LAB_001186bf;
            puVar14 = puVar23 + 1;
            uVar6 = (ulong)(ushort)(*puVar23 << 8 | *puVar23 >> 8);
            if ((ulong)((long)puVar16 - (long)puVar14) < uVar6) goto LAB_001186bf;
            puVar23 = (ushort *)((long)puVar23 + uVar6 + 2);
            if (uVar6 != 0) {
              iVar4 = 0x32;
              puVar10 = puVar14;
              do {
                if (((long)puVar23 - (long)puVar10 < 2) ||
                   (((long)puVar23 - (long)puVar10) - 2U < 2)) goto LAB_001186d8;
                uVar6 = (ulong)(ushort)(puVar10[1] << 8 | puVar10[1] >> 8);
                if ((ulong)((long)puVar23 - (long)(puVar10 + 2)) < uVar6) goto LAB_001186d8;
                puVar14 = (ushort *)((long)(puVar10 + 2) + uVar6);
                if ((char)*puVar10 < '\0') {
                  ppVar20 = (ptls_hpke_cipher_suite_t *)0x0;
                  ppVar18 = (ptls_hpke_cipher_suite_t *)0x0;
                }
                puVar10 = puVar14;
              } while (puVar14 < puVar23);
            }
            iVar4 = 0x32;
            if ((puVar14 == puVar23) && (puVar23 == puVar16)) {
              free(name);
              if ((!bVar2) &&
                 ((ppVar18 != (ptls_hpke_cipher_suite_t *)0x0 &&
                  (ppVar20 != (ptls_hpke_cipher_suite_t *)0x0)))) {
                decoded->id = (uint8_t)uVar11;
                *(undefined4 *)&decoded->field_0x4 = 0;
                *(undefined4 *)&decoded->field_0x1 = 0;
                decoded->kem = (ptls_hpke_kem_t *)ppVar18;
                (decoded->public_key).base = (uint8_t *)((long)puVar15 + 9);
                (decoded->public_key).len = uVar5;
                decoded->cipher = ppVar20;
                decoded->max_name_length = (uint8_t)uVar3;
                *(undefined4 *)&decoded->field_0x2c = 0;
                *(undefined4 *)&decoded->field_0x29 = 0;
                (decoded->public_name).base = (uint8_t *)puVar7;
                (decoded->public_name).len = sVar9;
                (decoded->bytes).base = (uint8_t *)puVar15;
                (decoded->bytes).len = (long)puVar16 - (long)puVar15;
                bVar2 = true;
              }
              goto LAB_00118694;
            }
          }
        }
LAB_001186d8:
        free(name);
        goto LAB_001186e3;
      }
LAB_00118694:
      iVar4 = 0x32;
      puVar15 = puVar16;
    } while (puVar16 != puVar19);
    if (puVar19 == (ushort *)(uVar8 + (long)puVar12)) {
      return 0;
    }
  }
LAB_001186e3:
  (decoded->bytes).base = (uint8_t *)0x0;
  (decoded->bytes).len = 0;
  (decoded->public_name).base = (uint8_t *)0x0;
  (decoded->public_name).len = 0;
  decoded->cipher = (ptls_hpke_cipher_suite_t *)0x0;
  *(undefined8 *)&decoded->max_name_length = 0;
  (decoded->public_key).base = (uint8_t *)0x0;
  (decoded->public_key).len = 0;
  *(undefined8 *)decoded = 0;
  decoded->kem = (ptls_hpke_kem_t *)0x0;
  return iVar4;
}

Assistant:

static int client_decode_ech_config_list(ptls_context_t *ctx, struct st_decoded_ech_config_t *decoded, ptls_iovec_t config_list)
{
    const uint8_t *src = config_list.base, *const end = src + config_list.len;
    int match_found = 0, ret;

    *decoded = (struct st_decoded_ech_config_t){0};

    ptls_decode_block(src, end, 2, {
        do {
            const uint8_t *config_start = src;
            uint16_t version;
            if ((ret = ptls_decode16(&version, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, {
                /* If the block is the one that we recognize, parse it, then adopt if if possible. Otherwise, skip. */
                if (version == PTLS_ECH_CONFIG_VERSION) {
                    struct st_decoded_ech_config_t thisconf;
                    if ((ret = decode_one_ech_config(ctx->ech.client.kems, ctx->ech.client.ciphers, &thisconf, &src, end)) != 0)
                        goto Exit;
                    if (!match_found && thisconf.kem != NULL && thisconf.cipher != NULL) {
                        *decoded = thisconf;
                        decoded->bytes = ptls_iovec_init(config_start, end - config_start);
                        match_found = 1;
                    }
                } else {
                    src = end;
                }
            });
        } while (src != end);
    });
    ret = 0;

Exit:
    if (ret != 0)
        *decoded = (struct st_decoded_ech_config_t){0};
    return ret;
}